

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcCrossProductsPartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  double dVar7;
  int k_1;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  array<double,_16UL> withinPattern;
  array<double,_16UL> acrossPatterns;
  value_type_conflict local_138;
  undefined1 local_130 [64];
  undefined1 local_f0 [64];
  array<double,_16UL> local_b0;
  
  auVar13._56_8_ = 0;
  auVar13._0_56_ = local_130._8_56_;
  local_130 = auVar13 << 0x40;
  std::array<double,_16UL>::fill(&local_b0,(value_type_conflict *)local_130);
  uVar8 = (ulong)(uint)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
  pdVar12 = preOrderPartial + 2;
  for (lVar9 = 0; lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
    local_138 = 0.0;
    std::array<double,_16UL>::fill((array<double,_16UL> *)local_130,&local_138);
    uVar6 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    uVar8 = (ulong)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    auVar15 = ZEXT816(0) << 0x40;
    lVar10 = 0;
    uVar11 = 0;
    while ((~((int)uVar6 >> 0x1f) & uVar6) != uVar11) {
      pdVar2 = categoryRates + uVar11;
      pdVar1 = categoryWeights + uVar11;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *pdVar1;
      auVar3 = *(undefined1 (*) [16])((long)pdVar12 + lVar10 + -0x10);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)((long)postOrderPartial + lVar10 + 0x18);
      uVar11 = uVar11 + 1;
      auVar13 = vpermpd_avx512f(_DAT_0014b040,ZEXT1664(auVar3));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)((long)postOrderPartial + lVar10);
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           *(double *)((long)pdVar12 + lVar10 + -8) *
           *(double *)((long)postOrderPartial + lVar10 + 8);
      auVar3 = vfmadd132sd_fma(auVar3,auVar19,auVar4);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)((long)postOrderPartial + lVar10 + 0x10);
      dVar7 = *pdVar1 * edgeLength * *pdVar2;
      pdVar2 = (double *)((long)postOrderPartial + lVar10);
      auVar17._0_8_ = dVar7 * *pdVar2;
      auVar17._8_8_ = dVar7 * pdVar2[1];
      auVar17._16_8_ = dVar7 * pdVar2[2];
      auVar17._24_8_ = dVar7 * pdVar2[3];
      auVar14 = vinsertf64x4_avx512f(ZEXT3264(auVar17),auVar17,1);
      local_130 = vfmadd231pd_avx512f(local_130,auVar14,auVar13);
      auVar3 = vfmadd213sd_fma(auVar20,*(undefined1 (*) [16])((long)pdVar12 + lVar10),auVar3);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)((long)pdVar12 + lVar10 + 8);
      auVar3 = vfmadd231sd_fma(auVar3,auVar21,auVar5);
      auVar13 = vpermpd_avx512f(_DAT_0014b040,
                                ZEXT1664(*(undefined1 (*) [16])((long)pdVar12 + lVar10)));
      lVar10 = lVar10 + uVar8 * 0x20;
      local_f0 = vfmadd231pd_avx512f(local_f0,auVar14,auVar13);
      auVar15 = vfmadd231sd_fma(auVar15,auVar18,auVar3);
    }
    auVar15._0_8_ = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights[lVar9] / auVar15._0_8_
    ;
    auVar15._8_8_ = 0;
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(local_130 + lVar10 * 8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_b0._M_elems[lVar10];
      auVar3 = vfmadd213sd_fma(auVar16,auVar15,auVar3);
      local_b0._M_elems[lVar10] = auVar3._0_8_;
    }
    pdVar12 = pdVar12 + 4;
    postOrderPartial = postOrderPartial + 4;
  }
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    outCrossProducts[lVar9] = local_b0._M_elems[lVar9] + outCrossProducts[lVar9];
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                        const REALTYPE *preOrderPartial,
                                                                        const double *categoryRates,
                                                                        const REALTYPE *categoryWeights,
                                                                        const double edgeLength,
                                                                        double *outCrossProducts,
                                                                        double *outSumSquaredDerivatives) {


#ifdef OLD_CP_PARTIALS
    return BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(postOrderPartial, preOrderPartial,
            categoryRates, categoryWeights, edgeLength, outCrossProducts, outSumSquaredDerivatives);
#else

    std::array<REALTYPE, 16> acrossPatterns;
    acrossPatterns.fill((REALTYPE) 0.0);

    std::array<REALTYPE, 16> withinPattern;

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        withinPattern.fill((REALTYPE) 0.0);

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;
            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * 4;

            PREFETCH_PARTIALS(pre, preOrderPartial, v);
            PREFETCH_PARTIALS(post, postOrderPartial, v);

            REALTYPE denominator = INNER_PRODUCT(pre, post);

            patternDenominator += denominator * weight;

            REALTYPE weightScale = weight * scale;

            ppost0 *= weightScale;
            ppost1 *= weightScale;
            ppost2 *= weightScale;
            ppost3 *= weightScale;

            withinPattern[0 * 4 + 0] += ppre0 * ppost0;
            withinPattern[0 * 4 + 1] += ppre0 * ppost1;
            withinPattern[0 * 4 + 2] += ppre0 * ppost2;
            withinPattern[0 * 4 + 3] += ppre0 * ppost3;

            withinPattern[1 * 4 + 0] += ppre1 * ppost0;
            withinPattern[1 * 4 + 1] += ppre1 * ppost1;
            withinPattern[1 * 4 + 2] += ppre1 * ppost2;
            withinPattern[1 * 4 + 3] += ppre1 * ppost3;

            withinPattern[2 * 4 + 0] += ppre2 * ppost0;
            withinPattern[2 * 4 + 1] += ppre2 * ppost1;
            withinPattern[2 * 4 + 2] += ppre2 * ppost2;
            withinPattern[2 * 4 + 3] += ppre2 * ppost3;

            withinPattern[3 * 4 + 0] += ppre3 * ppost0;
            withinPattern[3 * 4 + 1] += ppre3 * ppost1;
            withinPattern[3 * 4 + 2] += ppre3 * ppost2;
            withinPattern[3 * 4 + 3] += ppre3 * ppost3;
        }

        const auto patternWeight =  gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < 16; k++) {
            acrossPatterns[k] += withinPattern[k] * patternWeight;
        }
    }

    for (int k = 0; k < 16; k++) {
        outCrossProducts[k] += acrossPatterns[k];
    }
#endif
}